

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  Ref<embree::Geometry> *pRVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  int iVar6;
  uint uVar7;
  undefined4 uVar8;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  size_t i;
  long lVar17;
  long lVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 bi;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 ai;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar48;
  float fVar49;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar50;
  uint uVar55;
  uint uVar56;
  vint4 bi_1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint uVar57;
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined1 local_10b8 [16];
  undefined4 local_10a8;
  undefined4 uStack_10a4;
  undefined4 uStack_10a0;
  undefined4 uStack_109c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_fe8 [16];
  float local_fd8 [4];
  float local_fc8 [4];
  undefined1 local_fb8 [16];
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  vbool<4> valid;
  ulong uVar9;
  
  pauVar16 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  fVar45 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar20._4_4_ = fVar45;
  auVar20._0_4_ = fVar45;
  auVar20._8_4_ = fVar45;
  auVar20._12_4_ = fVar45;
  fVar48 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar21._4_4_ = fVar48;
  auVar21._0_4_ = fVar48;
  auVar21._8_4_ = fVar48;
  auVar21._12_4_ = fVar48;
  fVar49 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar22._4_4_ = fVar49;
  auVar22._0_4_ = fVar49;
  auVar22._8_4_ = fVar49;
  auVar22._12_4_ = fVar49;
  fVar45 = fVar45 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar48 = fVar48 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar49 = fVar49 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar12 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar6 = (tray->tfar).field_0.i[k];
  auVar54 = ZEXT1664(CONCAT412(iVar6,CONCAT48(iVar6,CONCAT44(iVar6,iVar6))));
  auVar31._0_8_ = CONCAT44(fVar45,fVar45) ^ 0x8000000080000000;
  auVar31._8_4_ = -fVar45;
  auVar31._12_4_ = -fVar45;
  auVar32._0_8_ = CONCAT44(fVar48,fVar48) ^ 0x8000000080000000;
  auVar32._8_4_ = -fVar48;
  auVar32._12_4_ = -fVar48;
  local_10a8 = 0x80000000;
  uStack_10a4 = 0x80000000;
  uStack_10a0 = 0x80000000;
  uStack_109c = 0x80000000;
  auVar33._0_8_ = CONCAT44(fVar49,fVar49) ^ 0x8000000080000000;
  auVar33._8_4_ = -fVar49;
  auVar33._12_4_ = -fVar49;
  iVar6 = (tray->tnear).field_0.i[k];
  auVar34._4_4_ = iVar6;
  auVar34._0_4_ = iVar6;
  auVar34._8_4_ = iVar6;
  auVar34._12_4_ = iVar6;
LAB_01568b34:
  do {
    do {
      if (pauVar16 == (undefined1 (*) [16])&local_f78) {
        return;
      }
      pauVar1 = pauVar16 + -1;
      pauVar16 = pauVar16 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar1 + 8));
    uVar11 = *(ulong *)*pauVar16;
    while ((uVar11 & 8) == 0) {
      auVar23 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar12),auVar31,auVar20);
      auVar35 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar14),auVar32,auVar21);
      auVar23 = vpmaxsd_avx(auVar23,auVar35);
      auVar35 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar11 + 0x20 + uVar15),auVar33,auVar22);
      auVar35 = vpmaxsd_avx(auVar35,auVar34);
      local_1038 = vpmaxsd_avx(auVar23,auVar35);
      auVar23 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar11 + 0x20 + (uVar12 ^ 0x10)),auVar31,
                                auVar20);
      auVar35 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar11 + 0x20 + (uVar14 ^ 0x10)),auVar32,
                                auVar21);
      auVar23 = vpminsd_avx(auVar23,auVar35);
      auVar35 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar11 + 0x20 + (uVar15 ^ 0x10)),auVar33,
                                auVar22);
      auVar35 = vpminsd_avx(auVar35,auVar54._0_16_);
      auVar23 = vpminsd_avx(auVar23,auVar35);
      auVar23 = vpcmpgtd_avx(local_1038,auVar23);
      iVar6 = vmovmskps_avx(auVar23);
      if (iVar6 == 0xf) goto LAB_01568b34;
      bVar5 = (byte)iVar6 ^ 0xf;
      uVar19 = uVar11 & 0xfffffffffffffff0;
      lVar17 = 0;
      for (uVar11 = (ulong)bVar5; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      uVar11 = *(ulong *)(uVar19 + lVar17 * 8);
      uVar7 = bVar5 - 1 & (uint)bVar5;
      uVar9 = (ulong)uVar7;
      if (uVar7 != 0) {
        uVar55 = *(uint *)(local_1038 + lVar17 * 4);
        lVar17 = 0;
        for (; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
          lVar17 = lVar17 + 1;
        }
        uVar7 = uVar7 - 1 & uVar7;
        uVar10 = (ulong)uVar7;
        uVar9 = *(ulong *)(uVar19 + lVar17 * 8);
        uVar56 = *(uint *)(local_1038 + lVar17 * 4);
        if (uVar7 == 0) {
          if (uVar55 < uVar56) {
            *(ulong *)*pauVar16 = uVar9;
            *(uint *)(*pauVar16 + 8) = uVar56;
            pauVar16 = pauVar16 + 1;
          }
          else {
            *(ulong *)*pauVar16 = uVar11;
            *(uint *)(*pauVar16 + 8) = uVar55;
            pauVar16 = pauVar16 + 1;
            uVar11 = uVar9;
          }
        }
        else {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar11;
          auVar23 = vpunpcklqdq_avx(auVar23,ZEXT416(uVar55));
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar9;
          auVar35 = vpunpcklqdq_avx(auVar35,ZEXT416(uVar56));
          lVar17 = 0;
          for (; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar7 = uVar7 - 1 & uVar7;
          uVar11 = (ulong)uVar7;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(uVar19 + lVar17 * 8);
          auVar24 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_1038 + lVar17 * 4)));
          auVar39 = vpcmpgtd_avx(auVar35,auVar23);
          if (uVar7 == 0) {
            auVar58 = vpshufd_avx(auVar39,0xaa);
            auVar39 = vblendvps_avx(auVar35,auVar23,auVar58);
            auVar23 = vblendvps_avx(auVar23,auVar35,auVar58);
            auVar35 = vpcmpgtd_avx(auVar24,auVar39);
            auVar58 = vpshufd_avx(auVar35,0xaa);
            auVar35 = vblendvps_avx(auVar24,auVar39,auVar58);
            auVar39 = vblendvps_avx(auVar39,auVar24,auVar58);
            auVar24 = vpcmpgtd_avx(auVar39,auVar23);
            auVar58 = vpshufd_avx(auVar24,0xaa);
            auVar24 = vblendvps_avx(auVar39,auVar23,auVar58);
            auVar23 = vblendvps_avx(auVar23,auVar39,auVar58);
            *pauVar16 = auVar23;
            pauVar16[1] = auVar24;
            uVar11 = auVar35._0_8_;
            pauVar16 = pauVar16 + 2;
          }
          else {
            lVar17 = 0;
            for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
              lVar17 = lVar17 + 1;
            }
            auVar58._8_8_ = 0;
            auVar58._0_8_ = *(ulong *)(uVar19 + lVar17 * 8);
            auVar25 = vpunpcklqdq_avx(auVar58,ZEXT416(*(uint *)(local_1038 + lVar17 * 4)));
            auVar58 = vpshufd_avx(auVar39,0xaa);
            auVar39 = vblendvps_avx(auVar35,auVar23,auVar58);
            auVar23 = vblendvps_avx(auVar23,auVar35,auVar58);
            auVar35 = vpcmpgtd_avx(auVar25,auVar24);
            auVar58 = vpshufd_avx(auVar35,0xaa);
            auVar35 = vblendvps_avx(auVar25,auVar24,auVar58);
            auVar24 = vblendvps_avx(auVar24,auVar25,auVar58);
            auVar58 = vpcmpgtd_avx(auVar24,auVar23);
            auVar25 = vpshufd_avx(auVar58,0xaa);
            auVar58 = vblendvps_avx(auVar24,auVar23,auVar25);
            auVar23 = vblendvps_avx(auVar23,auVar24,auVar25);
            auVar24 = vpcmpgtd_avx(auVar35,auVar39);
            auVar25 = vpshufd_avx(auVar24,0xaa);
            auVar24 = vblendvps_avx(auVar35,auVar39,auVar25);
            auVar35 = vblendvps_avx(auVar39,auVar35,auVar25);
            auVar39 = vpcmpgtd_avx(auVar58,auVar35);
            auVar25 = vpshufd_avx(auVar39,0xaa);
            auVar39 = vblendvps_avx(auVar58,auVar35,auVar25);
            auVar35 = vblendvps_avx(auVar35,auVar58,auVar25);
            *pauVar16 = auVar23;
            pauVar16[1] = auVar35;
            pauVar16[2] = auVar39;
            uVar11 = auVar24._0_8_;
            pauVar16 = pauVar16 + 3;
          }
        }
      }
    }
    uVar19 = uVar11 & 0xfffffffffffffff0;
    for (lVar17 = 0; lVar17 != (ulong)((uint)uVar11 & 0xf) - 8; lVar17 = lVar17 + 1) {
      lVar13 = lVar17 * 0xb0;
      auVar23 = *(undefined1 (*) [16])(uVar19 + 0x80 + lVar13);
      pauVar1 = (undefined1 (*) [16])(uVar19 + 0x40 + lVar13);
      auVar35 = *(undefined1 (*) [16])(uVar19 + 0x70 + lVar13);
      auVar39 = *(undefined1 (*) [16])(uVar19 + 0x50 + lVar13);
      auVar24._0_4_ = auVar23._0_4_ * *(float *)*pauVar1;
      auVar24._4_4_ = auVar23._4_4_ * *(float *)(*pauVar1 + 4);
      auVar24._8_4_ = auVar23._8_4_ * *(float *)(*pauVar1 + 8);
      auVar24._12_4_ = auVar23._12_4_ * *(float *)(*pauVar1 + 0xc);
      auVar37 = vfmsub231ps_fma(auVar24,auVar35,auVar39);
      pauVar2 = (undefined1 (*) [16])(uVar19 + 0x60 + lVar13);
      auVar24 = *(undefined1 (*) [16])(uVar19 + 0x30 + lVar13);
      auVar25._0_4_ = auVar39._0_4_ * *(float *)*pauVar2;
      auVar25._4_4_ = auVar39._4_4_ * *(float *)(*pauVar2 + 4);
      auVar25._8_4_ = auVar39._8_4_ * *(float *)(*pauVar2 + 8);
      auVar25._12_4_ = auVar39._12_4_ * *(float *)(*pauVar2 + 0xc);
      auVar44 = vfmsub231ps_fma(auVar25,auVar23,auVar24);
      uVar8 = *(undefined4 *)(ray + k * 4);
      auVar26._4_4_ = uVar8;
      auVar26._0_4_ = uVar8;
      auVar26._8_4_ = uVar8;
      auVar26._12_4_ = uVar8;
      auVar58 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + lVar13),auVar26);
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar27._4_4_ = uVar8;
      auVar27._0_4_ = uVar8;
      auVar27._8_4_ = uVar8;
      auVar27._12_4_ = uVar8;
      auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x10 + lVar13),auVar27);
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar28._4_4_ = uVar8;
      auVar28._0_4_ = uVar8;
      auVar28._8_4_ = uVar8;
      auVar28._12_4_ = uVar8;
      auVar26 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x20 + lVar13),auVar28);
      fVar45 = *(float *)(ray + k * 4 + 0x40);
      auVar46._4_4_ = fVar45;
      auVar46._0_4_ = fVar45;
      auVar46._8_4_ = fVar45;
      auVar46._12_4_ = fVar45;
      fVar48 = *(float *)(ray + k * 4 + 0x50);
      auVar36._4_4_ = fVar48;
      auVar36._0_4_ = fVar48;
      auVar36._8_4_ = fVar48;
      auVar36._12_4_ = fVar48;
      fVar49 = *(float *)(ray + k * 4 + 0x60);
      auVar61._4_4_ = fVar49;
      auVar61._0_4_ = fVar49;
      auVar61._8_4_ = fVar49;
      auVar61._12_4_ = fVar49;
      auVar29._0_4_ = fVar45 * auVar25._0_4_;
      auVar29._4_4_ = fVar45 * auVar25._4_4_;
      auVar29._8_4_ = fVar45 * auVar25._8_4_;
      auVar29._12_4_ = fVar45 * auVar25._12_4_;
      auVar27 = vfmsub231ps_fma(auVar29,auVar58,auVar36);
      auVar59._0_4_ = auVar23._0_4_ * auVar27._0_4_;
      auVar59._4_4_ = auVar23._4_4_ * auVar27._4_4_;
      auVar59._8_4_ = auVar23._8_4_ * auVar27._8_4_;
      auVar59._12_4_ = auVar23._12_4_ * auVar27._12_4_;
      auVar30._0_4_ = auVar39._0_4_ * auVar27._0_4_;
      auVar30._4_4_ = auVar39._4_4_ * auVar27._4_4_;
      auVar30._8_4_ = auVar39._8_4_ * auVar27._8_4_;
      auVar30._12_4_ = auVar39._12_4_ * auVar27._12_4_;
      auVar51._0_4_ = fVar49 * auVar58._0_4_;
      auVar51._4_4_ = fVar49 * auVar58._4_4_;
      auVar51._8_4_ = fVar49 * auVar58._8_4_;
      auVar51._12_4_ = fVar49 * auVar58._12_4_;
      auVar39 = vfmsub231ps_fma(auVar51,auVar26,auVar46);
      auVar23 = vfmadd231ps_fma(auVar59,auVar39,auVar35);
      auVar39 = vfmadd231ps_fma(auVar30,*pauVar1,auVar39);
      auVar52._0_4_ = auVar24._0_4_ * auVar35._0_4_;
      auVar52._4_4_ = auVar24._4_4_ * auVar35._4_4_;
      auVar52._8_4_ = auVar24._8_4_ * auVar35._8_4_;
      auVar52._12_4_ = auVar24._12_4_ * auVar35._12_4_;
      auVar28 = vfmsub231ps_fma(auVar52,*pauVar2,*pauVar1);
      auVar40._0_4_ = fVar48 * auVar26._0_4_;
      auVar40._4_4_ = fVar48 * auVar26._4_4_;
      auVar40._8_4_ = fVar48 * auVar26._8_4_;
      auVar40._12_4_ = fVar48 * auVar26._12_4_;
      auVar29 = vfmsub231ps_fma(auVar40,auVar61,auVar25);
      auVar62._0_4_ = auVar28._0_4_ * fVar49;
      auVar62._4_4_ = auVar28._4_4_ * fVar49;
      auVar62._8_4_ = auVar28._8_4_ * fVar49;
      auVar62._12_4_ = auVar28._12_4_ * fVar49;
      auVar35 = vfmadd231ps_fma(auVar62,auVar36,auVar44);
      auVar27 = vfmadd231ps_fma(auVar35,auVar46,auVar37);
      auVar35 = vfmadd231ps_fma(auVar23,auVar29,*pauVar2);
      auVar4._4_4_ = uStack_10a4;
      auVar4._0_4_ = local_10a8;
      auVar4._8_4_ = uStack_10a0;
      auVar4._12_4_ = uStack_109c;
      auVar23 = vandps_avx(auVar27,auVar4);
      uVar7 = auVar23._0_4_;
      local_1038._0_4_ = (float)(uVar7 ^ auVar35._0_4_);
      uVar55 = auVar23._4_4_;
      local_1038._4_4_ = (float)(uVar55 ^ auVar35._4_4_);
      uVar56 = auVar23._8_4_;
      local_1038._8_4_ = (float)(uVar56 ^ auVar35._8_4_);
      uVar57 = auVar23._12_4_;
      local_1038._12_4_ = (float)(uVar57 ^ auVar35._12_4_);
      auVar23 = vfmadd231ps_fma(auVar39,auVar24,auVar29);
      local_1028._0_4_ = (float)(uVar7 ^ auVar23._0_4_);
      local_1028._4_4_ = (float)(uVar55 ^ auVar23._4_4_);
      local_1028._8_4_ = (float)(uVar56 ^ auVar23._8_4_);
      local_1028._12_4_ = (float)(uVar57 ^ auVar23._12_4_);
      auVar39 = ZEXT816(0) << 0x20;
      auVar23 = vcmpps_avx(local_1038,auVar39,5);
      auVar35 = vcmpps_avx(local_1028,auVar39,5);
      auVar23 = vandps_avx(auVar23,auVar35);
      auVar47._8_4_ = 0x7fffffff;
      auVar47._0_8_ = 0x7fffffff7fffffff;
      auVar47._12_4_ = 0x7fffffff;
      local_1008 = vandps_avx(auVar27,auVar47);
      auVar35 = vcmpps_avx(auVar27,auVar39,4);
      auVar23 = vandps_avx(auVar23,auVar35);
      auVar41._0_4_ = local_1038._0_4_ + local_1028._0_4_;
      auVar41._4_4_ = local_1038._4_4_ + local_1028._4_4_;
      auVar41._8_4_ = local_1038._8_4_ + local_1028._8_4_;
      auVar41._12_4_ = local_1038._12_4_ + local_1028._12_4_;
      auVar35 = vcmpps_avx(auVar41,local_1008,2);
      auVar39 = auVar35 & auVar23;
      if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar39[0xf] < '\0'
         ) {
        auVar23 = vandps_avx(auVar23,auVar35);
        auVar42._0_4_ = auVar26._0_4_ * auVar28._0_4_;
        auVar42._4_4_ = auVar26._4_4_ * auVar28._4_4_;
        auVar42._8_4_ = auVar26._8_4_ * auVar28._8_4_;
        auVar42._12_4_ = auVar26._12_4_ * auVar28._12_4_;
        auVar35 = vfmadd132ps_fma(auVar25,auVar42,auVar44);
        auVar35 = vfmadd132ps_fma(auVar58,auVar35,auVar37);
        local_1018._0_4_ = (float)(uVar7 ^ auVar35._0_4_);
        local_1018._4_4_ = (float)(uVar55 ^ auVar35._4_4_);
        local_1018._8_4_ = (float)(uVar56 ^ auVar35._8_4_);
        local_1018._12_4_ = (float)(uVar57 ^ auVar35._12_4_);
        fVar45 = *(float *)(ray + k * 4 + 0x30);
        auVar43._0_4_ = local_1008._0_4_ * fVar45;
        auVar43._4_4_ = local_1008._4_4_ * fVar45;
        auVar43._8_4_ = local_1008._8_4_ * fVar45;
        auVar43._12_4_ = local_1008._12_4_ * fVar45;
        auVar35 = vcmpps_avx(auVar43,local_1018,1);
        fVar45 = *(float *)(ray + k * 4 + 0x80);
        auVar60._0_4_ = local_1008._0_4_ * fVar45;
        auVar60._4_4_ = local_1008._4_4_ * fVar45;
        auVar60._8_4_ = local_1008._8_4_ * fVar45;
        auVar60._12_4_ = local_1008._12_4_ * fVar45;
        auVar39 = vcmpps_avx(local_1018,auVar60,2);
        auVar35 = vandps_avx(auVar35,auVar39);
        auVar39 = auVar23 & auVar35;
        if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar39[0xf] < '\0') {
          local_10b8 = vandps_avx(auVar35,auVar23);
          local_fe8 = local_10b8;
          local_1108 = auVar37._0_8_;
          uStack_1100 = auVar37._8_8_;
          local_fa8 = local_1108;
          uStack_fa0 = uStack_1100;
          local_10f8 = auVar44._0_8_;
          uStack_10f0 = auVar44._8_8_;
          local_f98 = local_10f8;
          uStack_f90 = uStack_10f0;
          local_10e8 = auVar28._0_8_;
          uStack_10e0 = auVar28._8_8_;
          local_f88 = local_10e8;
          uStack_f80 = uStack_10e0;
          auVar23 = vrcpps_avx(local_1008);
          auVar44._8_4_ = 0x3f800000;
          auVar44._0_8_ = 0x3f8000003f800000;
          auVar44._12_4_ = 0x3f800000;
          auVar35 = vfnmadd213ps_fma(local_1008,auVar23,auVar44);
          auVar23 = vfmadd132ps_fma(auVar35,auVar23,auVar23);
          fVar45 = auVar23._0_4_;
          auVar53._0_4_ = fVar45 * local_1018._0_4_;
          fVar48 = auVar23._4_4_;
          auVar53._4_4_ = fVar48 * local_1018._4_4_;
          fVar49 = auVar23._8_4_;
          auVar53._8_4_ = fVar49 * local_1018._8_4_;
          fVar50 = auVar23._12_4_;
          auVar53._12_4_ = fVar50 * local_1018._12_4_;
          local_fb8 = auVar53;
          local_fd8[0] = fVar45 * local_1038._0_4_;
          local_fd8[1] = fVar48 * local_1038._4_4_;
          local_fd8[2] = fVar49 * local_1038._8_4_;
          local_fd8[3] = fVar50 * local_1038._12_4_;
          auVar37._8_4_ = 0x7f800000;
          auVar37._0_8_ = 0x7f8000007f800000;
          auVar37._12_4_ = 0x7f800000;
          auVar23 = vblendvps_avx(auVar37,auVar53,local_10b8);
          local_fc8[0] = fVar45 * local_1028._0_4_;
          local_fc8[1] = fVar48 * local_1028._4_4_;
          local_fc8[2] = fVar49 * local_1028._8_4_;
          local_fc8[3] = fVar50 * local_1028._12_4_;
          auVar35 = vshufps_avx(auVar23,auVar23,0xb1);
          auVar35 = vminps_avx(auVar35,auVar23);
          auVar39 = vshufpd_avx(auVar35,auVar35,1);
          auVar35 = vminps_avx(auVar39,auVar35);
          auVar23 = vcmpps_avx(auVar23,auVar35,0);
          auVar39 = local_10b8 & auVar23;
          auVar35 = vpcmpeqd_avx(auVar35,auVar35);
          if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar39[0xf] < '\0') {
            auVar35 = auVar23;
          }
          auVar23 = vandps_avx(local_10b8,auVar35);
          uVar8 = vmovmskps_avx(auVar23);
          lVar18 = 0;
          for (uVar9 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar8); (uVar9 & 1) == 0;
              uVar9 = uVar9 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          pRVar3 = (context->scene->geometries).items;
          uVar7 = *(uint *)(ray + k * 4 + 0x90);
          while (uVar55 = *(uint *)(lVar13 + uVar19 + 0x90 + lVar18 * 4),
                ((pRVar3[uVar55].ptr)->mask & uVar7) == 0) {
            *(undefined4 *)(local_10b8 + lVar18 * 4) = 0;
            if ((((local_10b8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_10b8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_10b8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_10b8[0xf]) goto LAB_01568f73;
            auVar38._8_4_ = 0x7f800000;
            auVar38._0_8_ = 0x7f8000007f800000;
            auVar38._12_4_ = 0x7f800000;
            auVar23 = vblendvps_avx(auVar38,auVar53,local_10b8);
            auVar35 = vshufps_avx(auVar23,auVar23,0xb1);
            auVar35 = vminps_avx(auVar35,auVar23);
            auVar39 = vshufpd_avx(auVar35,auVar35,1);
            auVar35 = vminps_avx(auVar39,auVar35);
            auVar35 = vcmpps_avx(auVar23,auVar35,0);
            auVar39 = local_10b8 & auVar35;
            auVar23 = local_10b8;
            if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar39[0xf] < '\0') {
              auVar23 = vandps_avx(auVar35,local_10b8);
            }
            uVar9 = (ulong)lVar18 >> 0x20;
            uVar8 = vmovmskps_avx(auVar23);
            lVar18 = 0;
            for (uVar9 = CONCAT44((int)uVar9,uVar8); (uVar9 & 1) == 0;
                uVar9 = uVar9 >> 1 | 0x8000000000000000) {
              lVar18 = lVar18 + 1;
            }
          }
          fVar45 = local_fd8[lVar18];
          fVar48 = local_fc8[lVar18];
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_fb8 + lVar18 * 4);
          *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_fa8 + lVar18 * 4);
          *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_f98 + lVar18 * 4);
          *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_f88 + lVar18 * 4);
          *(float *)(ray + k * 4 + 0xf0) = fVar45;
          *(float *)(ray + k * 4 + 0x100) = fVar48;
          *(undefined4 *)(ray + k * 4 + 0x110) =
               *(undefined4 *)(lVar13 + uVar19 + 0xa0 + lVar18 * 4);
          *(uint *)(ray + k * 4 + 0x120) = uVar55;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
        }
      }
LAB_01568f73:
    }
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar54 = ZEXT1664(CONCAT412(uVar8,CONCAT48(uVar8,CONCAT44(uVar8,uVar8))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }